

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplicationstatic.h
# Opt level: O0

void QtGlobalStatic::
     ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
     ::reset(void)

{
  long lVar1;
  long in_FS_OFFSET;
  QMutexLocker<QBasicMutex> locker;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  QMutexLocker<QBasicMutex> *this;
  QHostInfoLookupManager *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QHostInfoLookupManager *)0xaaaaaaaaaaaaaaaa;
  this = (QMutexLocker<QBasicMutex> *)&stack0xffffffffffffffe8;
  QMutexLocker<QBasicMutex>::QMutexLocker
            (this,(QBasicMutex *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  realPointer();
  QHostInfoLookupManager::~QHostInfoLookupManager(this_00);
  QBasicAtomicInteger<signed_char>::storeRelaxed
            ((QBasicAtomicInteger<signed_char> *)this,in_stack_ffffffffffffffdf);
  QMutexLocker<QBasicMutex>::~QMutexLocker(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void reset()
    {
        // we only synchronize using the mutex here, not the guard
        QMutexLocker locker(&mutex);
        realPointer()->~PlainType();
        guard.storeRelaxed(QtGlobalStatic::Uninitialized);
    }